

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeFunctor * __thiscall icu_63::UnicodeSet::freeze(UnicodeSet *this)

{
  int iVar1;
  UChar32 *pUVar2;
  UnicodeSetStringSpan *this_00;
  BMPSet *this_01;
  UnicodeSet *in_RSI;
  
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) {
    return (UnicodeFunctor *)this;
  }
  if ((this->fFlags & 1) != 0) {
    return (UnicodeFunctor *)this;
  }
  if (this->buffer != (UChar32 *)0x0) {
    uprv_free_63(this->buffer);
    this->buffer = (UChar32 *)0x0;
  }
  iVar1 = this->len;
  if (iVar1 + 0x10 < this->capacity) {
    iVar1 = iVar1 + (uint)(iVar1 == 0);
    this->capacity = iVar1;
    in_RSI = (UnicodeSet *)((long)iVar1 << 2);
    pUVar2 = (UChar32 *)uprv_realloc_63(this->list,(size_t)in_RSI);
    this->list = pUVar2;
    if (pUVar2 == (UChar32 *)0x0) goto LAB_001a319c;
  }
  if (this->strings->count != 0) {
    this_00 = (UnicodeSetStringSpan *)UMemory::operator_new((UMemory *)0x118,(size_t)in_RSI);
    if (this_00 == (UnicodeSetStringSpan *)0x0) {
      this_00 = (UnicodeSetStringSpan *)0x0;
    }
    else {
      in_RSI = this;
      UnicodeSetStringSpan::UnicodeSetStringSpan(this_00,this,this->strings,0x3f);
    }
    this->stringSpan = this_00;
    if ((this_00 != (UnicodeSetStringSpan *)0x0) && (this_00->maxLength16 == 0)) {
      UnicodeSetStringSpan::~UnicodeSetStringSpan(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
      this->stringSpan = (UnicodeSetStringSpan *)0x0;
    }
  }
  if (this->stringSpan != (UnicodeSetStringSpan *)0x0) {
    return (UnicodeFunctor *)this;
  }
  this_01 = (BMPSet *)UMemory::operator_new((UMemory *)0x368,(size_t)in_RSI);
  if (this_01 == (BMPSet *)0x0) {
    this_01 = (BMPSet *)0x0;
  }
  else {
    BMPSet::BMPSet(this_01,this->list,this->len);
  }
  this->bmpSet = this_01;
  if (this_01 != (BMPSet *)0x0) {
    return (UnicodeFunctor *)this;
  }
LAB_001a319c:
  clear(this);
  this->fFlags = '\x01';
  return (UnicodeFunctor *)this;
}

Assistant:

UnicodeFunctor *UnicodeSet::freeze() {
    if(!isFrozen() && !isBogus()) {
        // Do most of what compact() does before freezing because
        // compact() will not work when the set is frozen.
        // Small modification: Don't shrink if the savings would be tiny (<=GROW_EXTRA).

        // Delete buffer first to defragment memory less.
        if (buffer != NULL) {
            uprv_free(buffer);
            buffer = NULL;
        }
        if (capacity > (len + GROW_EXTRA)) {
            // Make the capacity equal to len or 1.
            // We don't want to realloc of 0 size.
            capacity = len + (len == 0);
            list = (UChar32*) uprv_realloc(list, sizeof(UChar32) * capacity);
            if (list == NULL) { // Check for memory allocation error.
                setToBogus();
                return this;
            }
        }

        // Optimize contains() and span() and similar functions.
        if (!strings->isEmpty()) {
            stringSpan = new UnicodeSetStringSpan(*this, *strings, UnicodeSetStringSpan::ALL);
            if (stringSpan != NULL && !stringSpan->needsStringSpanUTF16()) {
                // All strings are irrelevant for span() etc. because
                // all of each string's code points are contained in this set.
                // Do not check needsStringSpanUTF8() because UTF-8 has at most as
                // many relevant strings as UTF-16.
                // (Thus needsStringSpanUTF8() implies needsStringSpanUTF16().)
                delete stringSpan;
                stringSpan = NULL;
            }
        }
        if (stringSpan == NULL) {
            // No span-relevant strings: Optimize for code point spans.
            bmpSet=new BMPSet(list, len);
            if (bmpSet == NULL) { // Check for memory allocation error.
                setToBogus();
            }
        }
    }
    return this;
}